

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::UMdivideMOD(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  string local_48;
  
  requireDStackDepth(this,3,"UM/MOD");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar1 == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"UM/MOD: zero divisor","");
    throwCppExceptionMessage(this,&local_48,errorDivisionByZero);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,0);
  ForthStack<unsigned_int>::setTop(this_00,0,(uint)(CONCAT44(uVar3,uVar2) / (ulong)uVar1));
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)(CONCAT44(uVar3,uVar2) % (ulong)uVar1));
  return;
}

Assistant:

void UMdivideMOD(){
			REQUIRE_DSTACK_DEPTH(3, "UM/MOD");
			DCell n1(dStack.getTop()); dStack.pop();
			RUNTIME_ERROR_IF(n1.data_.Cells.lo == 0, "UM/MOD: zero divisor", errorDivisionByZero);
			DCell d1(dStack.getTop(1),dStack.getTop(0));
			DCell quotent(d1.data_.Dcells / n1.data_.Dcells); // n3
			dStack.setTop(0, quotent.data_.Cells.lo);
			DCell reminder(d1.data_.Dcells % n1.data_.Dcells); // n2
			dStack.setTop(1, reminder.data_.Cells.lo);
		}